

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_list_iterator.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  List<Employee_*> *this;
  Employee *pEVar2;
  long lVar3;
  PrintNEmployees pa;
  
  this = (List<Employee_*> *)operator_new(0x18);
  List<Employee_*>::List(this,200);
  pEVar2 = (Employee *)operator_new(1);
  lVar1 = this->_size;
  lVar3 = this->_count;
  if (lVar3 <= lVar1) {
    this->_items[lVar3] = pEVar2;
    lVar3 = lVar3 + 1;
    this->_count = lVar3;
  }
  pEVar2 = (Employee *)operator_new(1);
  if (lVar3 <= lVar1) {
    this->_items[lVar3] = pEVar2;
    lVar3 = lVar3 + 1;
    this->_count = lVar3;
  }
  pEVar2 = (Employee *)operator_new(1);
  if (lVar3 <= lVar1) {
    this->_items[lVar3] = pEVar2;
    this->_count = lVar3 + 1;
  }
  pa.super_ListTraverser<Employee_*>._iterator.super_Iterator<Employee_*>._vptr_Iterator =
       (_func_int **)&PTR_First_00103d48;
  pa.super_ListTraverser<Employee_*>._iterator._current = 0;
  pa.super_ListTraverser<Employee_*>._vptr_ListTraverser = (_func_int **)&PTR_ProcessItem_00103d08;
  pa._total = 10;
  pa._count = 0;
  pa.super_ListTraverser<Employee_*>._iterator._list = this;
  ListTraverser<Employee_*>::Traverse(&pa.super_ListTraverser<Employee_*>);
  return 0;
}

Assistant:

int main()
{
    List<Employee*>* employees;

    employees = new List<Employee*>;
    employees->Append(new Employee);
    employees->Append(new Employee);
    employees->Append(new Employee);

    PrintNEmployees pa(employees, 10);
    pa.Traverse();
}